

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fop.c
# Opt level: O0

Qiniu_Error
Qiniu_FOP_Prefop(Qiniu_Client *self,Qiniu_FOP_PrefopRet *ret,Qiniu_FOP_PrefopItemRet *itemsRet,
                Qiniu_ItemCount *itemsCount,char *persistentId,Qiniu_ItemCount maxItemsCount)

{
  int iVar1;
  char *pcVar2;
  char *url_00;
  Qiniu_Json *array;
  cJSON *self_00;
  Qiniu_Error QVar3;
  undefined4 uStack_d4;
  undefined4 uStack_c4;
  char *local_b8;
  char *apiHost;
  undefined1 auStack_a8 [4];
  Qiniu_Bool escapePersistentIdOk;
  Qiniu_Reader emptyBody;
  Qiniu_ReadBuf emptyBodyBuf;
  char *creationDateStr;
  char *url;
  char *encodedPersistentId;
  Qiniu_ItemCount curIndex;
  cJSON *item;
  cJSON *items;
  cJSON *root;
  char *pcStack_40;
  Qiniu_ItemCount maxItemsCount_local;
  char *persistentId_local;
  Qiniu_ItemCount *itemsCount_local;
  Qiniu_FOP_PrefopItemRet *itemsRet_local;
  Qiniu_FOP_PrefopRet *ret_local;
  Qiniu_Client *self_local;
  Qiniu_Error err;
  
  root._4_4_ = maxItemsCount;
  pcStack_40 = persistentId;
  persistentId_local = (char *)itemsCount;
  itemsCount_local = (Qiniu_ItemCount *)itemsRet;
  itemsRet_local = (Qiniu_FOP_PrefopItemRet *)ret;
  ret_local = (Qiniu_FOP_PrefopRet *)self;
  memset(&emptyBody.Read,0,0x18);
  _auStack_a8 = Qiniu_BufReader((Qiniu_ReadBuf *)&emptyBody.Read,(char *)0x0,0);
  pcVar2 = Qiniu_QueryEscape(pcStack_40,(Qiniu_Bool *)((long)&apiHost + 4));
  QVar3 = _Qiniu_Region_Get_Api_Host((Qiniu_Client *)ret_local,(char *)0x0,(char *)0x0,&local_b8);
  err._0_8_ = QVar3.message;
  self_local = (Qiniu_Client *)CONCAT44(uStack_c4,QVar3.code);
  if (QVar3.code == 200) {
    url_00 = Qiniu_String_Concat(local_b8,"/status/get/prefop?id=",pcVar2,0);
    if (apiHost._4_4_ != 0) {
      Qiniu_Free(pcVar2);
    }
    QVar3 = Qiniu_Client_CallWithMethod
                      ((Qiniu_Client *)ret_local,&items,url_00,_auStack_a8,0,
                       "application/x-www-form-urlencoded","GET",(char *)0x0);
    err._0_8_ = QVar3.message;
    self_local = (Qiniu_Client *)CONCAT44(uStack_d4,QVar3.code);
    Qiniu_Free(url_00);
    if ((int)self_local == 200) {
      pcVar2 = Qiniu_Json_GetString(items,"id",(char *)0x0);
      itemsRet_local->cmd = pcVar2;
      iVar1 = Qiniu_Json_GetInt(items,"code",0);
      itemsRet_local->code = iVar1;
      pcVar2 = Qiniu_Json_GetString(items,"desc",(char *)0x0);
      itemsRet_local->desc = pcVar2;
      pcVar2 = Qiniu_Json_GetString(items,"inputBucket",(char *)0x0);
      itemsRet_local->error = pcVar2;
      pcVar2 = Qiniu_Json_GetString(items,"inputBucket",(char *)0x0);
      itemsRet_local->hash = pcVar2;
      pcVar2 = Qiniu_Json_GetString(items,"taskFrom",(char *)0x0);
      itemsRet_local->key = pcVar2;
      iVar1 = Qiniu_Json_GetInt(items,"type",0);
      itemsRet_local->returnOld = iVar1;
      pcVar2 = Qiniu_Json_GetString(items,"creationDate",(char *)0x0);
      if (pcVar2 != (char *)0x0) {
        _Qiniu_Parse_Date_Time(pcVar2,(Qiniu_DateTime *)(itemsRet_local + 1));
      }
      iVar1 = Qiniu_Json_GetArraySize(items,"items",0);
      *(int *)persistentId_local = iVar1;
      array = Qiniu_Json_GetObjectItem(items,"items",(Qiniu_Json *)0x0);
      for (encodedPersistentId._4_4_ = 0;
          encodedPersistentId._4_4_ < *(int *)persistentId_local &&
          encodedPersistentId._4_4_ < root._4_4_;
          encodedPersistentId._4_4_ = encodedPersistentId._4_4_ + 1) {
        self_00 = cJSON_GetArrayItem(array,encodedPersistentId._4_4_);
        pcVar2 = Qiniu_Json_GetString(self_00,"cmd",(char *)0x0);
        *(char **)(itemsCount_local + (long)encodedPersistentId._4_4_ * 0xc) = pcVar2;
        iVar1 = Qiniu_Json_GetInt(self_00,"code",0);
        itemsCount_local[(long)encodedPersistentId._4_4_ * 0xc + 10] = iVar1;
        pcVar2 = Qiniu_Json_GetString(self_00,"desc",(char *)0x0);
        *(char **)(itemsCount_local + (long)encodedPersistentId._4_4_ * 0xc + 2) = pcVar2;
        pcVar2 = Qiniu_Json_GetString(self_00,"error",(char *)0x0);
        *(char **)(itemsCount_local + (long)encodedPersistentId._4_4_ * 0xc + 4) = pcVar2;
        pcVar2 = Qiniu_Json_GetString(self_00,"hash",(char *)0x0);
        *(char **)(itemsCount_local + (long)encodedPersistentId._4_4_ * 0xc + 6) = pcVar2;
        pcVar2 = Qiniu_Json_GetString(self_00,"key",(char *)0x0);
        *(char **)(itemsCount_local + (long)encodedPersistentId._4_4_ * 0xc + 8) = pcVar2;
        iVar1 = Qiniu_Json_GetInt(self_00,"returnOld",0);
        itemsCount_local[(long)encodedPersistentId._4_4_ * 0xc + 0xb] = iVar1;
      }
    }
  }
  QVar3._0_8_ = (ulong)self_local & 0xffffffff;
  QVar3.message = (char *)err._0_8_;
  return QVar3;
}

Assistant:

Qiniu_Error Qiniu_FOP_Prefop(Qiniu_Client *self, Qiniu_FOP_PrefopRet *ret, Qiniu_FOP_PrefopItemRet *itemsRet, Qiniu_ItemCount *itemsCount, const char *persistentId, Qiniu_ItemCount maxItemsCount)
{
    Qiniu_Error err;
    cJSON *root, *items, *item;
    Qiniu_ItemCount curIndex;
    char *encodedPersistentId = NULL, *url = NULL, *creationDateStr = NULL;
    Qiniu_ReadBuf emptyBodyBuf = {NULL, 0, 0};
    Qiniu_Reader emptyBody = Qiniu_BufReader(&emptyBodyBuf, 0, 0);
    Qiniu_Bool escapePersistentIdOk;

    encodedPersistentId = Qiniu_QueryEscape(persistentId, &escapePersistentIdOk);

    const char *apiHost;
    err = _Qiniu_Region_Get_Api_Host(self, NULL, NULL, &apiHost);
    if (err.code != 200)
    {
        return err;
    }
    url = Qiniu_String_Concat(apiHost, "/status/get/prefop?id=", encodedPersistentId, NULL);
    if (escapePersistentIdOk)
    {
        Qiniu_Free(encodedPersistentId);
    }

    err = Qiniu_Client_CallWithMethod(
        self,
        &root,
        url,
        emptyBody,
        0,
        "application/x-www-form-urlencoded",
        "GET",
        NULL);
    Qiniu_Free(url);
    if (err.code != 200)
    {
        return err;
    }

    ret->id = Qiniu_Json_GetString(root, "id", NULL);
    ret->code = Qiniu_Json_GetInt(root, "code", 0);
    ret->desc = Qiniu_Json_GetString(root, "desc", NULL);
    ret->inputBucket = Qiniu_Json_GetString(root, "inputBucket", NULL);
    ret->inputKey = Qiniu_Json_GetString(root, "inputBucket", NULL);
    ret->taskFrom = Qiniu_Json_GetString(root, "taskFrom", NULL);
    ret->type = Qiniu_Json_GetInt(root, "type", 0);
    creationDateStr = (char *)Qiniu_Json_GetString(root, "creationDate", NULL);
    if (creationDateStr != NULL)
    {
        _Qiniu_Parse_Date_Time(creationDateStr, &ret->creationDate);
    }

    *itemsCount = Qiniu_Json_GetArraySize(root, "items", 0);
    items = Qiniu_Json_GetObjectItem(root, "items", 0);
    for (curIndex = 0; curIndex < *itemsCount && curIndex < maxItemsCount; curIndex++)
    {
        item = cJSON_GetArrayItem(items, curIndex);
        itemsRet[curIndex].cmd = Qiniu_Json_GetString(item, "cmd", NULL);
        itemsRet[curIndex].code = Qiniu_Json_GetInt(item, "code", 0);
        itemsRet[curIndex].desc = Qiniu_Json_GetString(item, "desc", NULL);
        itemsRet[curIndex].error = Qiniu_Json_GetString(item, "error", NULL);
        itemsRet[curIndex].hash = Qiniu_Json_GetString(item, "hash", NULL);
        itemsRet[curIndex].key = Qiniu_Json_GetString(item, "key", NULL);
        itemsRet[curIndex].returnOld = Qiniu_Json_GetInt(item, "returnOld", 0);
    }
    return err;
}